

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

idx_t __thiscall
duckdb::StringValueResult::HandleMultiDelimiter(StringValueResult *this,idx_t buffer_pos)

{
  idx_t iVar1;
  idx_t iVar2;
  InternalException *this_00;
  ulong uVar3;
  allocator local_41;
  string local_40;
  
  iVar1 = (this->super_ScannerResult).last_position.buffer_pos;
  uVar3 = this->extra_delimiter_bytes + iVar1;
  iVar2 = buffer_pos - uVar3;
  if (buffer_pos < uVar3) {
    if (iVar1 != buffer_pos) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,
                 "Value size is lower than the number of extra delimiter bytes in the HandleMultiDelimiter(). buffer_pos = %d, last_position.buffer_pos = %d, extra_delimiter_bytes = %d"
                 ,&local_41);
      InternalException::InternalException<unsigned_long,unsigned_long,unsigned_long>
                (this_00,&local_40,buffer_pos,(this->super_ScannerResult).last_position.buffer_pos,
                 this->extra_delimiter_bytes);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

inline idx_t StringValueResult::HandleMultiDelimiter(const idx_t buffer_pos) const {
	idx_t size = buffer_pos - last_position.buffer_pos - extra_delimiter_bytes;
	if (buffer_pos < last_position.buffer_pos + extra_delimiter_bytes) {
		// If this is a scenario where the value is null, that is fine (e.g., delim = '||' and line is: A||)
		if (buffer_pos == last_position.buffer_pos) {
			size = 0;
		} else {
			// Otherwise something went wrong.
			throw InternalException(
			    "Value size is lower than the number of extra delimiter bytes in the HandleMultiDelimiter(). "
			    "buffer_pos = %d, last_position.buffer_pos = %d, extra_delimiter_bytes = %d",
			    buffer_pos, last_position.buffer_pos, extra_delimiter_bytes);
		}
	}
	return size;
}